

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_type.hpp
# Opt level: O0

payload_type * __thiscall
pstore::brokerface::message_type::
get_payload<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (payload_type *__return_storage_ptr__,message_type *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last)

{
  iterator __first;
  unsigned_long *puVar1;
  iterator __last;
  payload_type *result;
  char *local_58;
  iterator local_50;
  iterator out_first;
  long local_40;
  unsigned_long local_38;
  udistance_type count;
  message_type *local_28;
  difference_type local_20;
  difference_type dist;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_local;
  
  count = (udistance_type)first._M_current;
  local_28 = this;
  dist = (difference_type)first._M_current;
  last_local._M_current = (char *)this;
  local_20 = std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                       ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )this,first);
  local_40 = 0;
  puVar1 = (unsigned_long *)std::max<long>(&local_20,&local_40);
  local_38 = *puVar1;
  out_first = (iterator)0xf4;
  puVar1 = std::min<unsigned_long>(&local_38,(unsigned_long *)&out_first);
  local_38 = *puVar1;
  local_50 = std::begin<std::array<char,244ul>>(__return_storage_ptr__);
  if (local_38 != 0) {
    local_58 = last_local._M_current;
    local_50 = std::
               copy_n<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,char*>
                         (last_local,local_38,local_50);
  }
  __first = local_50;
  __last = std::end<std::array<char,244ul>>(__return_storage_ptr__);
  result._7_1_ = 0;
  std::fill<char*,char>(__first,__last,(char *)((long)&result + 7));
  return __return_storage_ptr__;
}

Assistant:

static payload_type get_payload (InputIterator first, InputIterator last) {
                payload_type result;

                auto dist = std::distance (first, last);
                using distance_type = decltype (dist);
                using udistance_type = typename std::make_unsigned<distance_type>::type;
                auto count = static_cast<udistance_type> (std::max (dist, distance_type{0}));

                static_assert (
                    payload_chars < std::numeric_limits<udistance_type>::max (),
                    "payload chars is too large for static conversion to difference_type");
                count = std::min (count, static_cast<udistance_type> (payload_chars));
                payload_type::iterator out_first = std::begin (result);
                if (count > 0) {
                    out_first = std::copy_n (first, count, out_first);
                }
                std::fill (out_first, std::end (result), '\0');
                return result;
            }